

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_code.cpp
# Opt level: O1

int compute_depth_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *this;
  int iVar3;
  Am_Object owner;
  Am_Object local_10;
  
  Am_Object::Get_Object(&local_10,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&local_10);
  iVar3 = -1;
  if (bVar1) {
    this = Am_Object::Get(&local_10,0x86,0);
    iVar2 = Am_Value::operator_cast_to_int(this);
    iVar3 = -1;
    if (iVar2 + 1 != 0) {
      iVar3 = iVar2 + 1;
    }
  }
  Am_Object::~Am_Object(&local_10);
  return iVar3;
}

Assistant:

Am_Define_Formula(int, compute_depth)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    int depth = owner.Get(Am_OWNER_DEPTH);
    if (depth == -1)
      return -1;
    else
      return depth + 1;
  } else
    return -1;
}